

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::add_extension(session_impl *this,ext_function_t *ext)

{
  undefined1 local_31;
  session_plugin_wrapper *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  shared_ptr<libtorrent::plugin> local_20;
  
  local_30 = (session_plugin_wrapper *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libtorrent::aux::session_impl::session_plugin_wrapper,std::allocator<libtorrent::aux::session_impl::session_plugin_wrapper>,std::function<std::shared_ptr<libtorrent::torrent_plugin>(libtorrent::torrent_handle_const&,libtorrent::client_data_t)>&>
            (&_Stack_28,&local_30,
             (allocator<libtorrent::aux::session_impl::session_plugin_wrapper> *)&local_31,ext);
  local_20.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_30->super_plugin;
  local_20.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_28._M_pi;
  local_30 = (session_plugin_wrapper *)0x0;
  _Stack_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  add_ses_extension(this,&local_20);
  if (local_20.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_28._M_pi);
  }
  return;
}

Assistant:

void session_impl::add_extension(ext_function_t ext)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(ext);

		add_ses_extension(std::make_shared<session_plugin_wrapper>(ext));
	}